

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(MemoryLeakOutputStringBuffer *this)

{
  ulong uVar1;
  int amountOfLeaks;
  
  amountOfLeaks = this->total_leaks_;
  if (amountOfLeaks == 0) {
    addNoMemoryLeaksMessage(this);
    return;
  }
  uVar1 = (this->outputBuffer_).write_limit_;
  (this->outputBuffer_).write_limit_ = 0xfff;
  if (uVar1 <= (this->outputBuffer_).positions_filled_) {
    addErrorMessageForTooMuchLeaks(this);
    amountOfLeaks = this->total_leaks_;
  }
  addMemoryLeakFooter(this,amountOfLeaks);
  if (this->giveWarningOnUsingMalloc_ == true) {
    addWarningForUsingMalloc(this);
    return;
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::stopMemoryLeakReporting()
{
    if (total_leaks_ == 0) {
        addNoMemoryLeaksMessage();
        return;
    }

    bool buffer_reached_its_capacity = outputBuffer_.reachedItsCapacity();
    outputBuffer_.resetWriteLimit();

    if (buffer_reached_its_capacity)
        addErrorMessageForTooMuchLeaks();

    addMemoryLeakFooter(total_leaks_);

    if (giveWarningOnUsingMalloc_)
        addWarningForUsingMalloc();

}